

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O3

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  int iVar2;
  size_t *in_RDX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  size_t length;
  long in_FS_OFFSET;
  Status *s;
  undefined1 local_50 [16];
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  length = *in_RDX;
  uVar3 = in_RDX[1];
  bVar6 = true;
  do {
    iVar2 = (int)slice->size_;
    if (0x8000 < iVar2) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("leftover >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,0x2d,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar2) {
      if (iVar2 != 0x8000) {
        local_50._8_8_ = ZEXT48(0x8000 - iVar2);
        local_50._0_8_ = "";
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_40,slice->data_,(Writer *)local_50);
        if (local_40 != (void *)0x0) {
          operator_delete__(local_40);
        }
      }
      *(undefined4 *)&slice->size_ = 0;
      iVar2 = 0;
    }
    if ((int)(0x7ff9U - iVar2) < 0) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("kBlockSize - block_offset_ - kHeaderSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,0x39,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    uVar4 = (ulong)(0x7ff9U - iVar2);
    uVar5 = uVar4;
    if (uVar3 < uVar4) {
      uVar5 = uVar3;
    }
    uVar1 = (uVar4 < uVar3) + 1;
    if (!bVar6) {
      uVar1 = 4 - (uVar4 < uVar3);
    }
    EmitPhysicalRecord((Writer *)local_50,(RecordType)slice,(char *)(ulong)uVar1,length);
    if ((WritableFile *)local_50._0_8_ != (WritableFile *)0x0) break;
    length = length + uVar5;
    bVar6 = false;
    uVar3 = uVar3 - uVar5;
  } while (uVar3 != 0);
  this->dest_ = (WritableFile *)local_50._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}